

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_pipeline(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  bool bVar1;
  uint uVar2;
  _func_int **pp_Var3;
  Allocator *pAVar4;
  int iVar5;
  int *piVar6;
  int k;
  _func_int *p_Var7;
  ulong uVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int _w;
  ulong uVar13;
  Mat local_c8;
  Mat local_78;
  
  p_Var7 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  uVar13 = (long)*(int *)(&this->field_0xd8 + (long)p_Var7) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var7);
  uVar2 = *(uint *)(&this->field_0x114 + (long)p_Var7);
  uVar11 = (long)*(int *)(&this->field_0x110 + (long)p_Var7) / (long)(int)uVar2;
  _w = (int)uVar13;
  uVar11 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) / (long)_w;
  if ((uVar2 == *(uint *)(&this->field_0xd0 + (long)p_Var7)) &&
     ((int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) /
           (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var7) / (int)uVar2)) * uVar2 == uVar2))
  {
    bVar1 = opt->use_packing_layout;
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    iVar12 = 0;
    Mat::create(&local_c8,*(int *)(&this->field_0x194 + (long)p_Var7),4,(Allocator *)0x0);
    pp_Var3 = this->_vptr_DeconvolutionDepthWise_x86;
    p_Var7 = pp_Var3[-3];
    lVar10 = *(long *)(&this->field_0x168 + (long)p_Var7);
    uVar11 = 0;
    if (0 < _w) {
      uVar11 = uVar13 & 0xffffffff;
    }
    pvVar9 = local_c8.data;
    while( true ) {
      iVar5 = *(int *)(&this->field_0x114 + (long)p_Var7);
      if ((int)((uVar2 - (int)uVar2 % iVar5) * (*(int *)(&this->field_0xd0 + (long)p_Var7) / iVar5))
          <= iVar12) break;
      iVar5 = _w;
      for (uVar8 = 0; iVar5 = iVar5 + -1, uVar11 != uVar8; uVar8 = uVar8 + 1) {
        *(undefined4 *)((long)pvVar9 + (long)iVar5 * 4) = *(undefined4 *)(lVar10 + uVar8 * 4);
      }
      pvVar9 = (void *)((long)pvVar9 + uVar13 * 4);
      iVar12 = iVar12 + 1;
      p_Var7 = pp_Var3[-3];
      lVar10 = lVar10 + uVar13 * 4;
    }
    if (((uVar2 & 3) == 0) && (bVar1 != false)) {
      Mat::reshape(&local_78,&local_c8,_w,iVar5,(Allocator *)0x0);
      convert_packing(&local_78,&this->weight_data_tm,4,opt);
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    }
    else {
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (&this->weight_data_tm != &local_c8) {
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (this->weight_data_tm).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pAVar4 = (this->weight_data_tm).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              free((this->weight_data_tm).data);
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).data = local_c8.data;
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        (this->weight_data_tm).refcount = piVar6;
        (this->weight_data_tm).elemsize =
             CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
        (this->weight_data_tm).elempack = local_c8.elempack;
        (this->weight_data_tm).allocator = local_c8.allocator;
        (this->weight_data_tm).dims = local_c8.dims;
        (this->weight_data_tm).w = local_c8.w;
        (this->weight_data_tm).h = local_c8.h;
        (this->weight_data_tm).d = local_c8.d;
        (this->weight_data_tm).c = local_c8.c;
        (this->weight_data_tm).cstep = local_c8.cstep;
      }
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    create_group_ops(this,opt);
    if (opt->lightmode == true) {
      p_Var7 = this->_vptr_DeconvolutionDepthWise_x86[-3];
      piVar6 = *(int **)(&this->field_0x170 + (long)p_Var7);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (*(long **)(&this->field_0x188 + (long)p_Var7) == (long *)0x0) {
            free(*(void **)(&this->field_0x168 + (long)p_Var7));
          }
          else {
            (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var7) + 0x18))();
          }
        }
      }
      *(undefined8 *)(&this->field_0x1a8 + (long)p_Var7) = 0;
      *(undefined8 *)(&this->field_0x174 + (long)p_Var7) = 0;
      *(undefined8 *)(&this->field_0x17c + (long)p_Var7) = 0;
      *(undefined8 *)(&this->field_0x168 + (long)p_Var7) = 0;
      *(undefined8 *)(&this->field_0x170 + (long)p_Var7) = 0;
      *(undefined8 *)(&this->field_0x190 + (long)p_Var7) = 0;
      *(undefined8 *)(&this->field_0x198 + (long)p_Var7) = 0;
      *(undefined4 *)(&this->field_0x1a0 + (long)p_Var7) = 0;
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}